

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtWrenchesAndJointTorquesEstimator.cpp
# Opt level: O0

bool __thiscall
iDynTree::ExtWrenchesAndJointTorquesEstimator::estimateLinkNetWrenchesWithoutGravity
          (ExtWrenchesAndJointTorquesEstimator *this,LinkNetTotalWrenchesWithoutGravity *netWrenches
          )

{
  Model *in_RSI;
  long in_RDI;
  LinkNetTotalWrenchesWithoutGravity *in_stack_00000108;
  LinkAccArray *in_stack_00000110;
  LinkVelArray *in_stack_00000118;
  Model *in_stack_00000120;
  bool local_1;
  
  if ((*(byte *)(in_RDI + 0x160) & 1) == 0) {
    iDynTree::reportError
              ("ExtWrenchesAndJointTorquesEstimator","estimateLinkNetWrenchesWithoutGravity",
               "Model and sensors information not set.");
    local_1 = false;
  }
  else if ((*(byte *)(in_RDI + 0x161) & 1) == 0) {
    iDynTree::reportError
              ("ExtWrenchesAndJointTorquesEstimator","estimateLinkNetWrenchesWithoutGravity",
               "Kinematic information not set.");
    local_1 = false;
  }
  else {
    iDynTree::LinkWrenches::resize(in_RSI);
    local_1 = computeLinkNetWrenchesWithoutGravity
                        (in_stack_00000120,in_stack_00000118,in_stack_00000110,in_stack_00000108);
  }
  return local_1;
}

Assistant:

bool ExtWrenchesAndJointTorquesEstimator::estimateLinkNetWrenchesWithoutGravity(LinkNetTotalWrenchesWithoutGravity& netWrenches)
{
   if( !m_isModelValid )
    {
        reportError("ExtWrenchesAndJointTorquesEstimator","estimateLinkNetWrenchesWithoutGravity",
                    "Model and sensors information not set.");
        return false;
    }

    if( !m_isKinematicsUpdated )
    {
        reportError("ExtWrenchesAndJointTorquesEstimator","estimateLinkNetWrenchesWithoutGravity",
                    "Kinematic information not set.");
        return false;
    }

    netWrenches.resize(m_model);

    return computeLinkNetWrenchesWithoutGravity(m_model,m_linkVels,m_linkProperAccs,netWrenches);
}